

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystemWithLoadedTexture_renderTextureInFullWindowSuccessfully_Test::
SDLGraphicsSystemWithLoadedTexture_renderTextureInFullWindowSuccessfully_Test
          (SDLGraphicsSystemWithLoadedTexture_renderTextureInFullWindowSuccessfully_Test *this)

{
  SDLGraphicsSystemWithLoadedTexture_renderTextureInFullWindowSuccessfully_Test *this_local;
  
  SDLGraphicsSystemWithLoadedTexture::SDLGraphicsSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  (this->super_SDLGraphicsSystemWithLoadedTexture).super_SDLGraphicsSystemWithCreatedWindowTests.
  super_SDLGraphicsSystemTests.super_Test._vptr_Test =
       (_func_int **)
       &PTR__SDLGraphicsSystemWithLoadedTexture_renderTextureInFullWindowSuccessfully_Test_005065d0;
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       renderTextureInFullWindowSuccessfully)
{
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   Eq(std::nullopt), Eq(std::nullopt))
    ).WillOnce(Return(success));

    system.renderTextureInFullWindow(textureId0);
    expectQuitSystemWithLoadedTexture();
}